

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Stats::getArrayAverage(Stats *this,int index)

{
  value_type_conflict *__x;
  reference pvVar1;
  value_type_conflict *pvVar2;
  reference ppBVar3;
  int in_EDX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  uint i;
  RealType v;
  vector<double,_std::allocator<double>_> *value;
  Accumulator *local_68;
  vector<double,_std::allocator<double>_> *this_00;
  uint local_24;
  ResultType local_20;
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  this_00 = in_RDI;
  local_14 = in_EDX;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x37b053);
  local_24 = 0;
  while( true ) {
    __x = (value_type_conflict *)(ulong)local_24;
    pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
             operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                         *)(in_RSI + 0x18),(long)local_14);
    pvVar2 = (value_type_conflict *)
             std::vector<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>::
             size(&pvVar1->accumulatorArray2d);
    if (pvVar2 <= __x) break;
    pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
             operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                         *)(in_RSI + 0x18),(long)local_14);
    ppBVar3 = std::vector<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>::
              operator[](&pvVar1->accumulatorArray2d,(ulong)local_24);
    if (*ppBVar3 == (value_type)0x0) {
      local_68 = (Accumulator *)0x0;
    }
    else {
      local_68 = (Accumulator *)
                 __dynamic_cast(*ppBVar3,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
    }
    Accumulator::getAverage(local_68,&local_20);
    std::vector<double,_std::allocator<double>_>::push_back(this_00,__x);
    local_24 = local_24 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<RealType> Stats::getArrayAverage(int index) {
    assert(index >= 0 && index < ENDINDEX);
    std::vector<RealType> value;
    RealType v;
    for (unsigned int i = 0; i < data_[index].accumulatorArray2d.size(); ++i) {
      dynamic_cast<Accumulator*>(data_[index].accumulatorArray2d[i])
          ->getAverage(v);
      value.push_back(v);
    }
    return value;
  }